

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

optional<long_long> __thiscall QHttpHeaders::intValue(QHttpHeaders *this,QAnyStringView name)

{
  QAnyStringView name_00;
  bool bVar1;
  QHttpHeadersPrivate *this_00;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  size_t in_RSI;
  HeaderName *in_RDI;
  long in_FS_OFFSET;
  optional<long_long> oVar3;
  qint64 result;
  bool ok;
  optional<QByteArrayView> v;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  bool *in_stack_ffffffffffffff60;
  QHttpHeadersPrivate *in_stack_ffffffffffffff80;
  _Storage<long_long,_true> local_38;
  undefined1 local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
                      ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c83d9);
  name_00.m_size = in_RSI;
  name_00.field_0.m_data = in_RDX.m_data;
  HeaderName::HeaderName
            ((HeaderName *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),name_00);
  QHttpHeadersPrivate::findValue(in_stack_ffffffffffffff80,in_RDI);
  HeaderName::~HeaderName((HeaderName *)0x1c842d);
  bVar1 = std::optional::operator_cast_to_bool((optional<QByteArrayView> *)0x1c8437);
  if (bVar1) {
    std::optional<QByteArrayView>::operator->((optional<QByteArrayView> *)0x1c8456);
    QByteArrayView::toLongLong
              ((QByteArrayView *)this_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    std::optional<long_long>::optional((optional<long_long> *)&local_38);
    uVar2 = extraout_RDX_00;
  }
  else {
    std::optional<long_long>::optional((optional<long_long> *)&local_38);
    uVar2 = extraout_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_engaged = (bool)local_30;
  oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_payload._M_value = local_38._M_value;
  return (optional<long_long>)
         oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>;
}

Assistant:

const noexcept
{
    std::optional<QByteArrayView> v = d->findValue(HeaderName{name});
    if (!v)
        return std::nullopt;
    bool ok = false;
    const qint64 result = v->toLongLong(&ok);
    if (ok)
        return result;
    return std::nullopt;
}